

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

void TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
     ::main(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  complex<long_double> *pcVar4;
  complex<long_double> *pcVar5;
  long lVar6;
  long col;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  TPZVec<int> NumConnected;
  TPZVec<long> DestInd3;
  TPZVec<long> DestInd2;
  TPZVec<long> DestInd1;
  TPZFMatrix<std::complex<long_double>_> KEl2;
  TPZFMatrix<std::complex<long_double>_> KEl1;
  TPZFMatrix<std::complex<long_double>_> KEl3;
  TPZFrontMatrix<std::complex<long_double>,_TPZFileEqnStorage<std::complex<long_double>_>,_TPZFrontSym<std::complex<long_double>_>_>
  TestFront;
  
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(&KEl1,2,2);
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl1,0,0);
  lVar7 = (longdouble)4.0;
  *(longdouble *)pcVar4->_M_value = lVar7;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl1,0,1);
  lVar8 = (longdouble)6.0;
  *(longdouble *)pcVar4->_M_value = lVar8;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl1,1,0);
  *(longdouble *)pcVar4->_M_value = lVar8;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl1,1,1);
  lVar9 = (longdouble)12.0;
  *(longdouble *)pcVar4->_M_value = lVar9;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  TPZVec<long>::TPZVec(&DestInd1,2);
  *DestInd1.fStore = 0;
  DestInd1.fStore[1] = 1;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(&KEl2,4,4);
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl2,0,0);
  *(longdouble *)pcVar4->_M_value = lVar7;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl2,0,1);
  *(longdouble *)pcVar4->_M_value = (longdouble)-6.0;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl2,0,2);
  *(longdouble *)pcVar4->_M_value = (longdouble)2.0;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl2,0,3);
  *(longdouble *)pcVar4->_M_value = lVar8;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl2,1,1);
  *(longdouble *)pcVar4->_M_value = lVar9;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl2,1,2);
  *(longdouble *)pcVar4->_M_value = (longdouble)-6.0;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl2,1,3);
  *(longdouble *)pcVar4->_M_value = (longdouble)-12.0;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl2,2,2);
  *(longdouble *)pcVar4->_M_value = lVar7;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl2,2,3);
  *(longdouble *)pcVar4->_M_value = lVar8;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl2,3,3);
  *(longdouble *)pcVar4->_M_value = lVar9;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  for (lVar6 = 0; col = lVar6, lVar6 != 4; lVar6 = lVar6 + 1) {
    for (; col != 4; col = col + 1) {
      pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl2,lVar6,col);
      pcVar5 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl2,col,lVar6);
      uVar1 = *(undefined8 *)pcVar4->_M_value;
      uVar2 = *(undefined8 *)(pcVar4->_M_value + 8);
      uVar3 = *(undefined8 *)(pcVar4->_M_value + 0x18);
      *(undefined8 *)(pcVar5->_M_value + 0x10) = *(undefined8 *)(pcVar4->_M_value + 0x10);
      *(undefined8 *)(pcVar5->_M_value + 0x18) = uVar3;
      *(undefined8 *)pcVar5->_M_value = uVar1;
      *(undefined8 *)(pcVar5->_M_value + 8) = uVar2;
    }
  }
  TPZVec<long>::TPZVec(&DestInd2,4);
  *DestInd2.fStore = 0;
  DestInd2.fStore[1] = 1;
  DestInd2.fStore[2] = 2;
  DestInd2.fStore[3] = 3;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(&KEl3,2,2);
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl3,0,0);
  lVar7 = (longdouble)3.0;
  *(longdouble *)pcVar4->_M_value = lVar7;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl3,0,1);
  *(longdouble *)pcVar4->_M_value = lVar7;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl1,1,0);
  *(longdouble *)pcVar4->_M_value = lVar7;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(&KEl3,1,1);
  *(longdouble *)pcVar4->_M_value = lVar8;
  *(longdouble *)(pcVar4->_M_value + 0x10) = (longdouble)0;
  TPZVec<long>::TPZVec(&DestInd3,2);
  *DestInd3.fStore = 2;
  DestInd3.fStore[1] = 3;
  TPZFrontMatrix(&TestFront,4);
  TPZVec<int>::TPZVec(&NumConnected,4);
  for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
    NumConnected.fStore[lVar6] = 2;
  }
  SetNumElConnected(&TestFront,&NumConnected);
  SymbolicAddKel(&TestFront,&DestInd1);
  SymbolicAddKel(&TestFront,&DestInd2);
  SymbolicAddKel(&TestFront,&DestInd3);
  AllocData(&TestFront);
  SetNumElConnected(&TestFront,&NumConnected);
  AddKel(&TestFront,&KEl1,&DestInd1);
  AddKel(&TestFront,&KEl2,&DestInd2);
  AddKel(&TestFront,&KEl3,&DestInd3);
  TPZVec<int>::~TPZVec(&NumConnected);
  ~TPZFrontMatrix(&TestFront);
  TPZVec<long>::~TPZVec(&DestInd3);
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&KEl3);
  TPZVec<long>::~TPZVec(&DestInd2);
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&KEl2);
  TPZVec<long>::~TPZVec(&DestInd1);
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix(&KEl1);
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::main()
{
	TPZFMatrix<TVar> KEl1(2,2);
	KEl1(0,0)=4.;
	KEl1(0,1)=6.;
	KEl1(1,0)=6.;
	KEl1(1,1)=12.;
	TPZVec<int64_t> DestInd1(2);
	DestInd1[0]=0;
	DestInd1[1]=1;
	
	
	TPZFMatrix<TVar> KEl2(4,4);
	KEl2(0,0)=4.;
	KEl2(0,1)=-6.;
	KEl2(0,2)=2.;
	KEl2(0,3)=6.;
	
	KEl2(1,1)=12;
	KEl2(1,2)=-6.;
	KEl2(1,3)=-12.;
	
	KEl2(2,2)=4.;
	KEl2(2,3)=6.;
	
	KEl2(3,3)=12.;
	
	int i, j;
	for(i=0;i<4;i++) {
		for(j=i;j<4;j++) KEl2(j,i)=KEl2(i,j);
	}
	
	TPZVec<int64_t> DestInd2(4);
	DestInd2[0]=0;
	DestInd2[1]=1;
	DestInd2[2]=2;
	DestInd2[3]=3;

	TPZFMatrix<TVar> KEl3(2,2);
	KEl3(0,0)=3.;
	KEl3(0,1)=3.;
	KEl1(1,0)=3.;
	KEl3(1,1)=6.;
	
	TPZVec<int64_t> DestInd3(2);
	DestInd3[0]=2;
	DestInd3[1]=3;

	TPZFrontMatrix TestFront(4);
	
	TPZVec<int> NumConnected(4);
	for(i=0;i<4;i++) NumConnected[i]=2;
	
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.SymbolicAddKel(DestInd1);
	TestFront.SymbolicAddKel(DestInd2);
	TestFront.SymbolicAddKel(DestInd3);
	
	TestFront.AllocData();
	TestFront.SetNumElConnected(NumConnected);
	
	TestFront.AddKel(KEl1,DestInd1);
	TestFront.AddKel(KEl2,DestInd2);
	TestFront.AddKel(KEl3,DestInd3);
}